

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyUtils.cpp
# Opt level: O2

bool isGlobalName(string *name,string *curFun)

{
  pair<bool,_int> pVar1;
  string sStack_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,(string *)name);
  std::__cxx11::string::string((string *)&sStack_48,(string *)curFun);
  pVar1 = SymbolTable::getAddr(&symbolTable,&local_28,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  return (bool)(pVar1.first & 1);
}

Assistant:

bool isGlobalName(string name, string curFun)
{

    return symbolTable.getAddr(name, curFun).first;
}